

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

bool __thiscall
DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
::HasNode(DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
          *this,NodeBase *node)

{
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
  *pDVar1;
  
  pDVar1 = this;
  do {
    pDVar1 = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
              *)(pDVar1->
                super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
                ).next.base;
    if (pDVar1 == this) break;
  } while (pDVar1 != (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
                      *)node);
  return pDVar1 != this;
}

Assistant:

bool HasNode(NodeBase * node) const
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            if (node == current)
            {
                return true;
            }
            current = current->Next();
        }
        return false;
    }